

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O3

void __thiscall wasm::BinaryInstWriter::visitTupleExtract(BinaryInstWriter *this,TupleExtract *curr)

{
  U32LEB x;
  Index IVar1;
  size_t sVar2;
  iterator iVar3;
  BufferWithRandomAccess *pBVar4;
  ulong uVar5;
  long lVar6;
  pair<std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>,_bool> pVar7;
  pair<const_wasm::Type,_unsigned_int> local_38;
  
  sVar2 = wasm::Type::size(&curr->tuple->type);
  IVar1 = curr->index;
  lVar6 = sVar2 - (IVar1 + 1);
  if (IVar1 + 1 <= sVar2 && lVar6 != 0) {
    do {
      BufferWithRandomAccess::operator<<(this->o,'\x1a');
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    IVar1 = curr->index;
  }
  if (IVar1 != 0) {
    iVar3 = std::
            _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<wasm::Type,_std::pair<const_wasm::Type,_std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&this->scratchLocals,
                   &(curr->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type
                  );
    if ((iVar3.
         super__Node_iterator_base<std::pair<const_wasm::Type,_std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>_>,_true>
         ._M_cur == (__node_type *)0x0) ||
       ((list<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
         *)*(undefined1 **)
            ((long)iVar3.
                   super__Node_iterator_base<std::pair<const_wasm::Type,_std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>_>,_true>
                   ._M_cur + 0x10) == &(this->scratchLocals).List)) {
      __assert_fail("scratchLocals.find(curr->type) != scratchLocals.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-stack.cpp"
                    ,0x7bf,"void wasm::BinaryInstWriter::visitTupleExtract(TupleExtract *)");
    }
    local_38.first.id =
         (curr->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type.id;
    local_38.second = 0;
    pVar7 = InsertOrderedMap<wasm::Type,_unsigned_int>::insert(&this->scratchLocals,&local_38);
    x.value = *(uint *)&pVar7.first._M_node._M_node[1]._M_prev;
    pBVar4 = BufferWithRandomAccess::operator<<(this->o,'!');
    BufferWithRandomAccess::operator<<(pBVar4,x);
    if (curr->index != 0) {
      uVar5 = 0;
      do {
        BufferWithRandomAccess::operator<<(this->o,'\x1a');
        uVar5 = uVar5 + 1;
      } while (uVar5 < curr->index);
    }
    pBVar4 = BufferWithRandomAccess::operator<<(this->o,' ');
    BufferWithRandomAccess::operator<<(pBVar4,x);
  }
  return;
}

Assistant:

void BinaryInstWriter::visitTupleExtract(TupleExtract* curr) {
  size_t numVals = curr->tuple->type.size();
  // Drop all values after the one we want
  for (size_t i = curr->index + 1; i < numVals; ++i) {
    o << int8_t(BinaryConsts::Drop);
  }
  // If the extracted value is the only one left, we're done
  if (curr->index == 0) {
    return;
  }
  // Otherwise, save it to a scratch local, drop the others, then retrieve it
  assert(scratchLocals.find(curr->type) != scratchLocals.end());
  auto scratch = scratchLocals[curr->type];
  o << int8_t(BinaryConsts::LocalSet) << U32LEB(scratch);
  for (size_t i = 0; i < curr->index; ++i) {
    o << int8_t(BinaryConsts::Drop);
  }
  o << int8_t(BinaryConsts::LocalGet) << U32LEB(scratch);
}